

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_string.c
# Opt level: O1

ssize_t mpt_encode_string(mpt_encode_state *info,iovec *to,iovec *from)

{
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  char *__s;
  void *pvVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong __n;
  ulong uVar12;
  char cVar13;
  iovec tmp;
  iovec local_40;
  
  if (to == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
  }
  else {
    sVar2 = info->done;
    __n = info->scratch;
    uVar1 = sVar2 + __n;
    uVar12 = to->iov_len;
    if (uVar12 < uVar1) {
      return -1;
    }
    pvVar3 = to->iov_base;
    if (from != (iovec *)0x0) {
      uVar4 = from->iov_len;
      if (uVar4 == 0) {
        return -1;
      }
      __s = (char *)from->iov_base;
      if (__s == (char *)0x0) {
        if (uVar1 != 0) {
          local_40.iov_len = uVar1 - (*(char *)((long)pvVar3 + (uVar1 - 1)) == '\0');
          lVar6 = uVar4 + 1;
          do {
            lVar6 = lVar6 + -1;
            if (lVar6 == 0) {
              info->done = info->done - local_40.iov_len;
              return local_40.iov_len;
            }
            local_40.iov_base = pvVar3;
            local_40.iov_len = mpt_memrchr(&local_40,1,(int)info->_ctx);
          } while (-1 < (long)local_40.iov_len);
        }
        return -0x10;
      }
      uVar12 = uVar12 - uVar1;
      if (uVar12 == 0) {
        return -0x11;
      }
      if (uVar4 < uVar12) {
        uVar12 = uVar4;
      }
      if (__n == 0) {
        pvVar5 = memchr(__s,(int)info->_ctx,uVar12);
        if (pvVar5 != (void *)0x0) {
          return -8;
        }
      }
      else {
        lVar6 = 1 - uVar4;
        if (uVar1 < uVar4) {
          lVar6 = -uVar1;
        }
        if (lVar6 < (long)(uVar12 - uVar4)) {
          pcVar7 = (char *)((long)pvVar3 + lVar6 + (uVar1 - uVar4));
          do {
            if (lVar6 == 0) {
              pcVar7 = __s;
            }
            cVar13 = '\x06';
            if (*pcVar7 == *(char *)((long)pvVar3 + uVar1)) {
              lVar8 = lVar6 + uVar4 + 1;
              if (lVar6 < lVar8) {
                lVar9 = 1;
                pcVar10 = pcVar7;
                do {
                  lVar11 = lVar6 + lVar9;
                  pcVar10 = pcVar10 + 1;
                  if (lVar11 == 0) {
                    pcVar10 = __s;
                  }
                  if (*pcVar10 != *(char *)((long)pvVar3 + lVar9 + uVar1)) goto LAB_0011152f;
                  lVar9 = lVar9 + 1;
                } while (lVar6 < lVar8);
                lVar11 = lVar9 + lVar6;
              }
              else {
                lVar11 = lVar6 + 1;
              }
LAB_0011152f:
              cVar13 = lVar11 == lVar8;
            }
            if ((cVar13 != '\x06') && (cVar13 != '\0')) {
              return -3;
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 < (long)(uVar12 - uVar4));
        }
        memmove((void *)((long)pvVar3 + ((uVar12 + uVar1) - __n)),(void *)((long)pvVar3 + sVar2),__n
               );
      }
      memcpy((void *)((long)pvVar3 + sVar2),from->iov_base,uVar12);
      info->done = uVar1 + uVar12;
      return uVar12;
    }
    if (__n == 0) {
      if (uVar12 == uVar1) {
        return -0x11;
      }
      *(char *)((long)pvVar3 + uVar1) = (char)info->_ctx;
      __n = 1;
    }
    else {
      if (uVar12 - uVar1 < __n) {
        return -0x11;
      }
      memcpy((void *)(sVar2 + (long)pvVar3),(void *)((long)pvVar3 + uVar1),__n);
    }
    info->done = __n + uVar1;
  }
  return 0;
}

Assistant:

extern ssize_t mpt_encode_string(MPT_STRUCT(encode_state) *info, const struct iovec *to, const struct iovec *from)
{
	uint8_t *base;
	size_t sep, len, off, max;
	
	if (!to) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	sep = info->scratch;
	off = info->done + info->scratch;
	
	base = to->iov_base;
	max  = to->iov_len;
	
	if (off > max) {
		return -1;
	}
	/* terminate string */
	if (!from) {
		max -= off;
		
		if (!sep) {
			if (!max) {
				return MPT_ERROR(MissingBuffer);
			}
			base[off++] = info->_ctx;
		}
		else if (max < sep) {
			return MPT_ERROR(MissingBuffer);
		}
		else {
			base += off;
			memcpy(base-sep, base, sep);
			off += sep;
		}
		info->done = off;
		
		/* push delimiter data */
		return 0;
	}
	/* start priority data */
	if (!(len = from->iov_len)) {
		return MPT_ERROR(BadArgument);
	}
	/* delete buffered data */
	if (!from->iov_base) {
		/* no data available */
		if (!off) {
			return MPT_ERROR(MissingData);
		}
		/* no active message, remove endbyte */
		if (!(base)[off-1]) {
			--off;
		}
		while (len--) {
			struct iovec tmp;
			ssize_t pos;
			
			tmp.iov_base = base;
			tmp.iov_len  = off;
			
			/* find message separator */
			if ((pos = mpt_memrchr(&tmp, 1, info->_ctx)) >= 0) {
				off = pos;
				continue;
			}
			return MPT_ERROR(MissingData);
		}
		info->done -= off;
		
		return off;
	}
	if (!(max -= off)) {
		return MPT_ERROR(MissingBuffer);
	}
	base += off;
	if (len < max) {
		max = from->iov_len;
	}
	/* invalid data */
	if (len) {
		if (!sep) {
			if (max && memchr(from->iov_base, info->_ctx, max)) {
				return MPT_ERROR(BadEncoding);
			}
		}
		/* check longer separator pattern */
		else {
			const uint8_t *cmp = base, *val;
			ssize_t i, total;
			
			/* relative compare start position */
			i = (off < len) ? -off : 1 - len;
			
			total = max - len;
			for (val = base - len + i; i < total; ++i, ++val) {
				const uint8_t *v2, *c2;
				ssize_t j, k;
				if (!i) val = from->iov_base;
				if (*val != *cmp) continue;
				v2 = val + 1;
				c2 = cmp + 1;
				for (j = i+1, k = j+len; i < k; ++j) {
					if (!j) v2 = from->iov_base;
					if (*(v2++) != *(c2++)) {
						break;
					}
				}
				if (j == k) {
					return -3;
				}
			}
			/* move delimiter string */
			memmove(base+max-sep, base-sep, sep);
		}
	}
	else if (memchr(from->iov_base, info->_ctx, max)) {
		return MPT_ERROR(BadEncoding);
	}
	/* copy source data */
	memcpy(base-sep, from->iov_base, max);
	off += max;
	
	info->done = off;
	
	return max;
}